

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O1

Element __thiscall ftxui::anon_unknown_3::ToggleBase::Render(ToggleBase *this)

{
  Components *pCVar1;
  int iVar2;
  ToggleBase *pTVar3;
  bool bVar4;
  pointer psVar5;
  Components *pCVar6;
  int *piVar7;
  int iVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *__x;
  long lVar9;
  Element EVar10;
  Elements children;
  Decorator style;
  ulong local_180;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_178;
  code *local_160;
  pointer *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  ToggleBase *local_120;
  ComponentBase *local_118;
  long local_110;
  Element local_108;
  Element local_f8;
  string local_e8;
  ftxui local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ftxui local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  Elements local_68;
  _Any_data local_50;
  code *local_40;
  
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ComponentBase::Focused(in_RSI);
  local_158 = &in_RSI[1].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar5 == (pointer)0x0) {
    psVar5 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)local_158,
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi -
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr >> 5);
  if (bVar4) {
    local_160 = focus;
  }
  else {
    local_160 = select;
  }
  local_118 = in_RSI + 1;
  pCVar1 = &in_RSI[2].children_;
  lVar9 = 0;
  local_180 = 0;
  local_120 = this;
  while( true ) {
    pTVar3 = local_120;
    psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
    if (psVar5 == (pointer)0x0) {
      psVar5 = in_RSI[1].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((ulong)((long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_refcount._M_pi -
                (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr >> 5) <= local_180) break;
    if (local_180 != 0) {
      separator();
      std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
      emplace_back<std::shared_ptr<ftxui::Node>>
                ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>
                  *)&local_178,(shared_ptr<ftxui::Node> *)&local_a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
    }
    pCVar6 = (Components *)
             in_RSI[7].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar6 == (Components *)0x0) {
      pCVar6 = pCVar1;
    }
    piVar7 = (int *)(pCVar6 + 8);
    if (*(int **)((long)(pCVar6 + 8) + 8) != (int *)0x0) {
      piVar7 = *(int **)((long)(pCVar6 + 8) + 8);
    }
    iVar8 = (int)local_180;
    iVar2 = *(int *)&((in_RSI[1].children_.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (iVar8 == iVar2) {
      if (iVar8 != *piVar7 || !bVar4) {
        pCVar6 = (Components *)
                 in_RSI[7].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar6 == (Components *)0x0) {
          pCVar6 = pCVar1;
        }
        __x = (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
              ((long)(pCVar6 + 2) + 0x10);
      }
      else {
        pCVar6 = (Components *)
                 in_RSI[7].children_.
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar6 == (Components *)0x0) {
          pCVar6 = pCVar1;
        }
        __x = (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)(pCVar6 + 4);
      }
    }
    else if (iVar8 != *piVar7 || !bVar4) {
      __x = (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
            in_RSI[7].children_.
            super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (__x == (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)0x0) {
        __x = (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)pCVar1;
      }
    }
    else {
      pCVar6 = (Components *)
               in_RSI[7].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pCVar6 == (Components *)0x0) {
        pCVar6 = pCVar1;
      }
      __x = (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
            ((long)(pCVar6 + 1) + 8);
    }
    local_110 = lVar9;
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8,
               __x);
    local_150 = local_160;
    if (iVar8 != iVar2) {
      local_150 = nothing;
    }
    ConstStringListRef::operator[][abi_cxx11_(&local_e8,(ConstStringListRef *)local_118,local_180);
    lVar9 = local_110;
    text((ftxui *)&local_108,&local_e8);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_88,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8);
    operator|(local_c8,&local_108,(Decorator *)&local_88);
    local_148._8_8_ = 0;
    local_148._M_unused._M_object = local_150;
    pcStack_130 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_manager;
    operator|((ftxui *)&local_f8,(Element *)local_c8,(Decorator *)&local_148);
    reflect((Box *)((long)&((*local_158)->
                           super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar9));
    operator|(local_b8,&local_f8,(Decorator *)&local_50);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               &local_178,(shared_ptr<ftxui::Node> *)local_b8);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_f8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    local_180 = local_180 + 1;
    lVar9 = lVar9 + 0x10;
  }
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_178.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_178.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hbox((ftxui *)local_120,&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_178);
  EVar10.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar10.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pTVar3
  ;
  return (Element)EVar10.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements children;
    bool is_toggle_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      // Separator.
      if (i != 0)
        children.push_back(separator());

      bool is_focused = (focused_entry() == int(i)) && is_toggle_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected        ? nothing
                              : is_toggle_focused ? focus
                                                  : select;
      children.push_back(text(entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return hbox(std::move(children));
  }